

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O2

void __thiscall ddd::DaTrie<true,_true,_false>::pack_bc(DaTrie<true,_true,_false> *this)

{
  pointer pBVar1;
  uint32_t base;
  ulong uVar2;
  Bc BVar3;
  int iVar4;
  Query query;
  Edge edge;
  
  query.key_ = (char *)0x0;
  query.pos_ = 0;
  query.value_ = 0x7fffffff;
  query.node_pos_ = 0;
  query.is_finished_ = false;
  memset(&edge,0,0x108);
  do {
    if (this->bc_emps_ < 0x100) {
      return;
    }
    pBVar1 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar2 = (ulong)((long)(this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)pBVar1) >> 3;
    iVar4 = -1;
    do {
      if (iVar4 == -0x101) {
        BVar3 = pBVar1[uVar2 + 0xffffff00 & 0xffffffff];
        break;
      }
      BVar3 = pBVar1[(uint)((int)uVar2 + iVar4)];
      iVar4 = iVar4 + -1;
    } while (-1 < (long)BVar3);
    query.node_pos_ = BVar3._4_4_ & 0x7fffffff;
    edge_(this,query.node_pos_,&edge,0x100);
    base = excheck_(this,&edge,&this->blocks_);
    if (base == 0xffffffff) {
      return;
    }
    shelter_(this,base,&edge,&query);
    move_(this,query.node_pos_,base,&edge,&query);
  } while( true );
}

Assistant:

void pack_bc() {
    assert(!Prefix);

    Query query;
    Edge edge;

    while (BLOCK_SIZE <= bc_emps()) {
      auto max_pos = bc_size();
      for (uint32_t i = 0; i < BLOCK_SIZE; ++i) {
        if (bc_[--max_pos].is_fixed()) {
          break;
        }
      }
      assert(bc_[max_pos].is_fixed());

      query.set_node_pos(bc_[max_pos].check());
      edge_(query.node_pos(), edge);

      auto base = excheck_(edge, blocks_);
      if (base == NOT_FOUND) {
        break;
      }

      shelter_(base, edge, query);
      move_(query.node_pos(), base, edge, query);
    }
  }